

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O1

void __thiscall amrex::MLEBABecLap::normalize(MLEBABecLap *this,int amrlev,int mglev,MultiFab *mf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  _Head_base<0UL,_amrex::MultiFab_*,_false> _Var7;
  int iVar8;
  ulong uVar9;
  uint ncomp;
  FabType FVar10;
  long lVar11;
  FabArray<amrex::EBCellFlagFab> *pFVar12;
  int *piVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  Real dhz;
  Real dhy;
  Real dhx;
  Box tbx;
  MFIter mfi;
  MFItInfo mfi_info;
  int local_b54;
  long local_b48;
  MultiCutFab *local_af0;
  MultiCutFab *local_ae8;
  FabArray<amrex::FArrayBox> *local_ae0;
  Box local_aa4;
  MultiCutFab *local_a88;
  MultiCutFab *pMStack_a80;
  MultiCutFab *local_a78;
  MultiCutFab *local_a68;
  MultiCutFab *pMStack_a60;
  MultiCutFab *local_a58;
  long local_a48;
  double local_a40;
  double local_a38;
  FabArray<amrex::IArrayBox> *local_a30;
  double local_a28;
  double local_a20;
  FabArray<amrex::FArrayBox> *local_a18;
  FabArray<amrex::FArrayBox> *local_a10;
  FabArray<amrex::FArrayBox> *local_a08;
  FabArray<amrex::EBCellFlagFab> *local_a00;
  FabArray<amrex::FArrayBox> *local_9f8;
  ulong local_9f0;
  ulong local_9e8;
  long local_9e0;
  long local_9d8;
  long local_9d0;
  ulong local_9c8;
  long local_9c0;
  Array4<const_double> local_9b8;
  Array4<const_double> local_978;
  Array4<const_double> local_938;
  Array4<double> local_8f8;
  Array4<const_double> local_8b8;
  Array4<const_double> local_878;
  undefined8 local_838;
  undefined8 uStack_830;
  double *local_828;
  Long LStack_820;
  Long local_818;
  Long LStack_810;
  Box local_808;
  MFIter local_7e0;
  Array4<const_double> local_780;
  Array4<const_double> local_740;
  Array4<const_double> local_700;
  Array4<const_double> local_6c0;
  Array4<const_double> local_680;
  Array4<const_double> local_640;
  Array4<const_double> local_600;
  Array4<const_double> local_5c0;
  Array4<const_double> local_580;
  Array4<const_amrex::EBCellFlag> local_540;
  Array4<const_int> local_500;
  MFItInfo local_4bc;
  anon_class_1136_23_0525a3f5 local_4a8;
  
  local_a48 = (long)amrlev;
  lVar20 = (long)mglev;
  local_9f8 = (FabArray<amrex::FArrayBox> *)
              (*(long *)&(this->m_a_coeffs).
                         super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         .
                         super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[local_a48].
                         super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                         super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> +
              lVar20 * 0x180);
  local_a30 = (FabArray<amrex::IArrayBox> *)
              (lVar20 * 0x180 +
              *(long *)&(this->m_cc_mask).
                        super_vector<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>,_std::allocator<amrex::Vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_a48].
                        super_vector<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>.
                        super__Vector_base<amrex::iMultiFab,_std::allocator<amrex::iMultiFab>_>);
  lVar15 = *(long *)&(this->m_b_coeffs).
                     super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_a48].
                     super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     .
                     super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar11 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_a48].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar17 = lVar20 * 200;
  dVar1 = *(double *)(lVar11 + 0x38 + lVar17);
  dVar2 = *(double *)(lVar11 + 0x40 + lVar17);
  dVar3 = *(double *)(lVar11 + 0x48 + lVar17);
  dVar4 = this->m_b_scalar;
  lVar11 = *(long *)(*(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_factory
                               .
                               super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[local_a48].
                               super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                               .
                               super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                    + lVar20 * 8);
  if (lVar11 == 0) {
    lVar11 = 0;
  }
  else {
    lVar11 = __dynamic_cast(lVar11,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
  }
  if (lVar11 == 0) {
    pFVar12 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_ae0 = (FabArray<amrex::FArrayBox> *)0x0;
    local_a68 = (MultiCutFab *)0x0;
    pMStack_a60 = (MultiCutFab *)0x0;
    local_a58 = (MultiCutFab *)0x0;
    local_a88 = (MultiCutFab *)0x0;
    pMStack_a80 = (MultiCutFab *)0x0;
    local_a78 = (MultiCutFab *)0x0;
    local_ae8 = (MultiCutFab *)0x0;
    local_af0 = (MultiCutFab *)0x0;
  }
  else {
    pFVar12 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar11 + 0xd8));
    local_ae0 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar11 + 0xd8))->
                 super_FabArray<amrex::FArrayBox>;
    EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar11 + 0xd8));
    EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar11 + 0xd8));
    local_ae8 = EBDataCollection::getBndryArea(*(EBDataCollection **)(lVar11 + 0xd8));
    local_af0 = EBDataCollection::getBndryCent(*(EBDataCollection **)(lVar11 + 0xd8));
  }
  _Var7._M_head_impl =
       *(MultiFab **)
        &(((this->m_eb_phi).
           super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           .
           super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
  local_828 = (double *)0x0;
  LStack_820 = 0;
  local_818 = 0;
  LStack_810 = 0;
  local_838 = 0;
  uStack_830._0_4_ = 0;
  uStack_830._4_4_ = 0;
  dVar5 = this->m_a_scalar;
  dVar6 = this->m_b_scalar;
  ncomp = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  local_4bc.device_sync = true;
  local_4bc.num_streams = Gpu::Device::max_gpu_streams;
  local_4bc.do_tiling = true;
  local_4bc.dynamic = false;
  local_4bc.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_4bc.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_4bc.tilesize.vect[2] = DAT_0083cec0;
  MFIter::MFIter(&local_7e0,(FabArrayBase *)mf,&local_4bc);
  if (local_7e0.currentIndex < local_7e0.endIndex) {
    lVar11 = lVar20 * 0x480;
    local_a08 = (FabArray<amrex::FArrayBox> *)(lVar15 + lVar11);
    local_a10 = (FabArray<amrex::FArrayBox> *)(lVar15 + 0x180 + lVar11);
    local_a18 = (FabArray<amrex::FArrayBox> *)(lVar15 + 0x300 + lVar11);
    local_a38 = dVar1 * dVar4 * dVar1;
    local_a40 = dVar2 * dVar4 * dVar2;
    local_a20 = dVar1 * dVar6 * dVar1;
    local_a28 = dVar2 * dVar6 * dVar2;
    local_9f0 = (ulong)ncomp;
    local_a00 = pFVar12;
    do {
      pFVar12 = local_a00;
      MFIter::tilebox(&local_aa4,&local_7e0);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_8f8,&mf->super_FabArray<amrex::FArrayBox>,&local_7e0);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_8b8,local_9f8,&local_7e0);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_938,local_a08,&local_7e0);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_978,local_a10,&local_7e0);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_9b8,local_a18,&local_7e0);
      FVar10 = regular;
      if (pFVar12 != (FabArray<amrex::EBCellFlagFab> *)0x0) {
        piVar13 = &local_7e0.currentIndex;
        if (local_7e0.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar13 = ((local_7e0.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_7e0.currentIndex;
        }
        FVar10 = EBCellFlagFab::getType
                           ((pFVar12->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar13],&local_aa4);
      }
      if (FVar10 == singlevalued) {
        if ((_Head_base<0UL,_amrex::MultiFab_*,_false>)_Var7._M_head_impl ==
            (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
          local_878.kstride = local_818;
          local_878.nstride = LStack_810;
          local_878.p = local_828;
          local_878.jstride = LStack_820;
          local_878.begin.x = 1;
          local_878.begin.y = 1;
          local_878.begin.z = 1;
          local_878.end.x = (int)local_838;
          local_878.end.y = (int)((ulong)local_838 >> 0x20);
          local_878.end.z = (int)uStack_830;
          local_878.ncomp = uStack_830._4_4_;
        }
        else {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_878,
                     *(FabArray<amrex::FArrayBox> **)
                      (*(long *)&(this->m_eb_b_coeffs).
                                 super_vector<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 .
                                 super__Vector_base<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[local_a48].
                                 super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                                 .
                                 super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      + lVar20 * 8),&local_7e0);
        }
        FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                  (&local_500,local_a30,&local_7e0);
        FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                  (&local_540,pFVar12,&local_7e0);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_580,local_ae0,&local_7e0);
        MultiCutFab::const_array(&local_5c0,local_a68,&local_7e0);
        MultiCutFab::const_array(&local_600,pMStack_a60,&local_7e0);
        MultiCutFab::const_array(&local_640,local_a58,&local_7e0);
        MultiCutFab::const_array(&local_680,local_a88,&local_7e0);
        MultiCutFab::const_array(&local_6c0,pMStack_a80,&local_7e0);
        MultiCutFab::const_array(&local_700,local_a78,&local_7e0);
        MultiCutFab::const_array(&local_740,local_ae8,&local_7e0);
        MultiCutFab::const_array(&local_780,local_af0,&local_7e0);
        local_4a8.beta_on_centroid = this->m_beta_loc == FaceCentroid;
        local_4a8.flag.end.z = local_540.end.z;
        local_4a8.flag.ncomp = local_540.ncomp;
        local_4a8.flag.begin.x = local_540.begin.x;
        local_4a8.flag.begin.y = local_540.begin.y;
        local_4a8.flag.kstride = local_540.kstride;
        local_4a8.flag.nstride = local_540.nstride;
        local_4a8.flag.p = local_540.p;
        local_4a8.flag.jstride = local_540.jstride;
        local_4a8.phi.end.z = local_8f8.end.z;
        local_4a8.phi.ncomp = local_8f8.ncomp;
        local_4a8.phi.kstride = local_8f8.kstride;
        local_4a8.phi.nstride = local_8f8.nstride;
        local_4a8.phi.p = local_8f8.p;
        local_4a8.phi.jstride = local_8f8.jstride;
        local_4a8.a.end.z = local_8b8.end.z;
        local_4a8.a.ncomp = local_8b8.ncomp;
        local_4a8.a.kstride = local_8b8.kstride;
        local_4a8.a.nstride = local_8b8.nstride;
        local_4a8.a.p = local_8b8.p;
        local_4a8.a.jstride = local_8b8.jstride;
        local_4a8.dhx = local_a38;
        local_4a8.bX.end.z = local_938.end.z;
        local_4a8.bX.ncomp = local_938.ncomp;
        local_4a8.bX.kstride = local_938.kstride;
        local_4a8.bX.nstride = local_938.nstride;
        local_4a8.bX.p = local_938.p;
        local_4a8.bX.jstride = local_938.jstride;
        local_4a8.dhy = local_a40;
        local_4a8.bY.end.z = local_978.end.z;
        local_4a8.bY.ncomp = local_978.ncomp;
        local_4a8.bY.kstride = local_978.kstride;
        local_4a8.bY.nstride = local_978.nstride;
        local_4a8.bY.p = local_978.p;
        local_4a8.bY.jstride = local_978.jstride;
        local_4a8.bZ.end.z = local_9b8.end.z;
        local_4a8.bZ.ncomp = local_9b8.ncomp;
        local_4a8.bZ.kstride = local_9b8.kstride;
        local_4a8.bZ.nstride = local_9b8.nstride;
        local_4a8.bZ.p = local_9b8.p;
        local_4a8.bZ.jstride = local_9b8.jstride;
        local_4a8.vfrc.end.z = local_580.end.z;
        local_4a8.vfrc.ncomp = local_580.ncomp;
        local_4a8.vfrc.begin.x = local_580.begin.x;
        local_4a8.vfrc.begin.y = local_580.begin.y;
        local_4a8.vfrc.kstride = local_580.kstride;
        local_4a8.vfrc.nstride = local_580.nstride;
        local_4a8.vfrc.p = local_580.p;
        local_4a8.vfrc.jstride = local_580.jstride;
        local_4a8.apx.end.z = local_5c0.end.z;
        local_4a8.apx.ncomp = local_5c0.ncomp;
        local_4a8.apx.begin.x = local_5c0.begin.x;
        local_4a8.apx.begin.y = local_5c0.begin.y;
        local_4a8.apx.kstride = local_5c0.kstride;
        local_4a8.apx.nstride = local_5c0.nstride;
        local_4a8.apx.p = local_5c0.p;
        local_4a8.apx.jstride = local_5c0.jstride;
        local_4a8.apy.end.z = local_600.end.z;
        local_4a8.apy.ncomp = local_600.ncomp;
        local_4a8.apy.begin.x = local_600.begin.x;
        local_4a8.apy.begin.y = local_600.begin.y;
        local_4a8.apy.kstride = local_600.kstride;
        local_4a8.apy.nstride = local_600.nstride;
        local_4a8.apy.p = local_600.p;
        local_4a8.apy.jstride = local_600.jstride;
        local_4a8.apz.end.z = local_640.end.z;
        local_4a8.apz.ncomp = local_640.ncomp;
        local_4a8.apz.begin.x = local_640.begin.x;
        local_4a8.apz.begin.y = local_640.begin.y;
        local_4a8.apz.kstride = local_640.kstride;
        local_4a8.apz.nstride = local_640.nstride;
        local_4a8.apz.p = local_640.p;
        local_4a8.apz.jstride = local_640.jstride;
        local_4a8.fcx.end.z = local_680.end.z;
        local_4a8.fcx.ncomp = local_680.ncomp;
        local_4a8.fcx.begin.x = local_680.begin.x;
        local_4a8.fcx.begin.y = local_680.begin.y;
        local_4a8.fcx.kstride = local_680.kstride;
        local_4a8.fcx.nstride = local_680.nstride;
        local_4a8.fcx.p = local_680.p;
        local_4a8.fcx.jstride = local_680.jstride;
        local_4a8.ccm.end.z = local_500.end.z;
        local_4a8.ccm.ncomp = local_500.ncomp;
        local_4a8.ccm.begin.x = local_500.begin.x;
        local_4a8.ccm.begin.y = local_500.begin.y;
        local_4a8.ccm.kstride = local_500.kstride;
        local_4a8.ccm.nstride = local_500.nstride;
        local_4a8.ccm.p = local_500.p;
        local_4a8.ccm.jstride = local_500.jstride;
        local_4a8.fcy.end.z = local_6c0.end.z;
        local_4a8.fcy.ncomp = local_6c0.ncomp;
        local_4a8.fcy.begin.x = local_6c0.begin.x;
        local_4a8.fcy.begin.y = local_6c0.begin.y;
        local_4a8.fcy.kstride = local_6c0.kstride;
        local_4a8.fcy.nstride = local_6c0.nstride;
        local_4a8.fcy.p = local_6c0.p;
        local_4a8.fcy.jstride = local_6c0.jstride;
        local_4a8.fcz.end.z = local_700.end.z;
        local_4a8.fcz.ncomp = local_700.ncomp;
        local_4a8.fcz.begin.x = local_700.begin.x;
        local_4a8.fcz.begin.y = local_700.begin.y;
        local_4a8.fcz.kstride = local_700.kstride;
        local_4a8.fcz.nstride = local_700.nstride;
        local_4a8.fcz.p = local_700.p;
        local_4a8.fcz.jstride = local_700.jstride;
        local_4a8.bc.end.z = local_780.end.z;
        local_4a8.bc.ncomp = local_780.ncomp;
        local_4a8.bc.begin.x = local_780.begin.x;
        local_4a8.bc.begin.y = local_780.begin.y;
        local_4a8.bc.kstride = local_780.kstride;
        local_4a8.bc.nstride = local_780.nstride;
        local_4a8.bc.p = local_780.p;
        local_4a8.bc.jstride = local_780.jstride;
        local_4a8.ba.end.z = local_740.end.z;
        local_4a8.ba.ncomp = local_740.ncomp;
        local_4a8.ba.begin.x = local_740.begin.x;
        local_4a8.ba.begin.y = local_740.begin.y;
        local_4a8.ba.kstride = local_740.kstride;
        local_4a8.ba.nstride = local_740.nstride;
        local_4a8.ba.p = local_740.p;
        local_4a8.ba.jstride = local_740.jstride;
        local_4a8.beb.end.y = local_878.end.y;
        local_4a8.beb.end.z = local_878.end.z;
        local_4a8.beb.ncomp = local_878.ncomp;
        local_4a8.beb.begin.x = local_878.begin.x;
        local_4a8.beb.begin.y = local_878.begin.y;
        local_4a8.beb.begin.z = local_878.begin.z;
        local_4a8.beb.end.x = local_878.end.x;
        local_4a8.beb.kstride = local_878.kstride;
        local_4a8.beb.nstride = local_878.nstride;
        local_4a8.beb.p = local_878.p;
        local_4a8.beb.jstride = local_878.jstride;
        local_4a8.alpha = dVar5;
        local_4a8.dhz = dVar4 * dVar3 * dVar3;
        local_4a8.is_dirichlet =
             (tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>)_Var7._M_head_impl !=
             (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0;
        Loop<amrex::mlebabeclap_normalize(amrex::Box_const&,amrex::Array4<double>const&,double,amrex::Array4<double_const>const&,double,double,double,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<int_const>const&,amrex::Array4<amrex::EBCellFlag_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,bool,bool,int)::_lambda(int,int,int,int)_1_>
                  (&local_808,ncomp,&local_4a8);
      }
      else if ((FVar10 == regular) && (0 < (int)ncomp)) {
        local_9c8 = (ulong)(uint)local_aa4.bigend.vect[1];
        lVar11 = (long)local_aa4.smallend.vect[1];
        lVar15 = (long)local_aa4.smallend.vect[0] * 8;
        local_b48 = 0;
        uVar9 = 0;
        do {
          local_9e8 = uVar9;
          iVar8 = local_aa4.smallend.vect[2];
          local_b54 = local_aa4.smallend.vect[2];
          if (local_aa4.smallend.vect[2] <= local_aa4.bigend.vect[2]) {
            do {
              local_b54 = local_b54 + 1;
              if (local_aa4.smallend.vect[1] <= local_aa4.bigend.vect[1]) {
                lVar16 = (long)iVar8;
                local_9e0 = (long)local_978.begin.y;
                local_9d0 = (long)local_9b8.begin.y;
                local_9d8 = local_9b8.kstride;
                lVar22 = (long)local_938.p +
                         local_938.nstride * local_b48 +
                         (lVar11 - local_938.begin.y) * local_938.jstride * 8 +
                         (lVar16 - local_938.begin.z) * local_938.kstride * 8 +
                         (long)local_938.begin.x * -8 + lVar15 + 8;
                lVar26 = local_978.jstride * 8;
                lVar17 = local_978.nstride * local_b48 +
                         (lVar16 - local_978.begin.z) * local_978.kstride * 8;
                lVar19 = (long)local_978.p +
                         (lVar11 - local_9e0) * lVar26 + lVar17 + (long)local_978.begin.x * -8 +
                         lVar15;
                local_9c0 = (long)local_978.p + lVar17 + (long)local_978.begin.x * -8 + lVar15;
                iVar24 = (local_aa4.smallend.vect[1] + 1) - local_978.begin.y;
                lVar23 = local_9b8.jstride * 8;
                lVar17 = (lVar11 - local_9d0) * lVar23;
                lVar21 = (long)local_9b8.p +
                         (long)(local_b54 - local_9b8.begin.z) * local_9b8.kstride * 8 + lVar17 +
                         local_9b8.nstride * local_b48 + (long)local_9b8.begin.x * -8 + lVar15;
                lVar18 = (long)local_9b8.p +
                         (lVar16 - local_9b8.begin.z) * local_9b8.kstride * 8 + lVar17 +
                         local_9b8.nstride * local_b48 + (long)local_9b8.begin.x * -8 + lVar15;
                lVar14 = (long)local_8f8.p +
                         local_8f8.nstride * local_b48 +
                         (lVar11 - local_8f8.begin.y) * local_8f8.jstride * 8 +
                         (lVar16 - local_8f8.begin.z) * local_8f8.kstride * 8 +
                         (long)local_8f8.begin.x * -8 + lVar15;
                lVar16 = (long)local_8b8.p +
                         (lVar11 - local_8b8.begin.y) * local_8b8.jstride * 8 +
                         (lVar16 - local_8b8.begin.z) * local_8b8.kstride * 8 +
                         (long)local_8b8.begin.x * -8 + lVar15;
                lVar17 = lVar11;
                do {
                  if (local_aa4.smallend.vect[0] <= local_aa4.bigend.vect[0]) {
                    lVar25 = 0;
                    do {
                      *(double *)(lVar14 + lVar25 * 8) =
                           *(double *)(lVar14 + lVar25 * 8) /
                           ((*(double *)(lVar18 + lVar25 * 8) + *(double *)(lVar21 + lVar25 * 8)) *
                            dVar6 * dVar3 * dVar3 +
                           (*(double *)(lVar19 + lVar25 * 8) +
                           *(double *)(iVar24 * lVar26 + local_9c0 + lVar25 * 8)) * local_a28 +
                           *(double *)(lVar16 + lVar25 * 8) * dVar5 +
                           (*(double *)(lVar22 + -8 + lVar25 * 8) + *(double *)(lVar22 + lVar25 * 8)
                           ) * local_a20);
                      lVar25 = lVar25 + 1;
                    } while ((local_aa4.bigend.vect[0] - local_aa4.smallend.vect[0]) + 1 !=
                             (int)lVar25);
                  }
                  lVar17 = lVar17 + 1;
                  lVar22 = lVar22 + local_938.jstride * 8;
                  lVar19 = lVar19 + lVar26;
                  iVar24 = iVar24 + 1;
                  lVar21 = lVar21 + lVar23;
                  lVar18 = lVar18 + lVar23;
                  lVar14 = lVar14 + local_8f8.jstride * 8;
                  lVar16 = lVar16 + local_8b8.jstride * 8;
                } while (local_aa4.bigend.vect[1] + 1U != (int)lVar17);
              }
              bVar27 = iVar8 != local_aa4.bigend.vect[2];
              iVar8 = iVar8 + 1;
            } while (bVar27);
          }
          local_b48 = local_b48 + 8;
          uVar9 = local_9e8 + 1;
        } while (local_9e8 + 1 != local_9f0);
      }
      MFIter::operator++(&local_7e0);
    } while (local_7e0.currentIndex < local_7e0.endIndex);
  }
  MFIter::~MFIter(&local_7e0);
  return;
}

Assistant:

void
MLEBABecLap::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const iMultiFab& ccmask = m_cc_mask[amrlev][mglev];

    const auto dxinvarray = m_geom[amrlev][mglev].InvCellSizeArray();
    AMREX_D_TERM(Real dhx = m_b_scalar*dxinvarray[0]*dxinvarray[0];,
                 Real dhy = m_b_scalar*dxinvarray[1]*dxinvarray[1];,
                 Real dhz = m_b_scalar*dxinvarray[2]*dxinvarray[2];);

    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][mglev].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    auto area = (factory) ? factory->getAreaFrac()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    auto fcent = (factory) ? factory->getFaceCent()
        : Array<const MultiCutFab*,AMREX_SPACEDIM>{AMREX_D_DECL(nullptr,nullptr,nullptr)};
    const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
    const MultiCutFab* bcent = (factory) ? &(factory->getBndryCent()) : nullptr;

    bool is_eb_dirichlet =  isEBDirichlet();

    Array4<Real const> foo;

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;
    const int ncomp = getNComp();

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf, mfi_info); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& fab = mf.array(mfi);
        Array4<Real const> const& afab = acoef.const_array(mfi);
        AMREX_D_TERM(Array4<Real const> const& bxfab = bxcoef.const_array(mfi);,
                     Array4<Real const> const& byfab = bycoef.const_array(mfi);,
                     Array4<Real const> const& bzfab = bzcoef.const_array(mfi););

        auto fabtyp = (flags) ? (*flags)[mfi].getType(bx) : FabType::regular;

        if (fabtyp == FabType::regular)
        {
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab, byfab, bzfab),
                                    dxinvarray, ascalar, bscalar);
            });
        }
        else if (fabtyp == FabType::singlevalued)
        {
            Array4<Real const> const& bebfab
                = (is_eb_dirichlet) ? m_eb_b_coeffs[amrlev][mglev]->const_array(mfi) : foo;
            Array4<int const> const& ccmfab = ccmask.const_array(mfi);
            Array4<EBCellFlag const> const& flagfab = flags->const_array(mfi);
            Array4<Real const> const& vfracfab = vfrac->const_array(mfi);
            AMREX_D_TERM(Array4<Real const> const& apxfab = area[0]->const_array(mfi);,
                         Array4<Real const> const& apyfab = area[1]->const_array(mfi);,
                         Array4<Real const> const& apzfab = area[2]->const_array(mfi););
            AMREX_D_TERM(Array4<Real const> const& fcxfab = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcyfab = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fczfab = fcent[2]->const_array(mfi););
            Array4<Real const> const& bafab = barea->const_array(mfi);
            Array4<Real const> const& bcfab = bcent->const_array(mfi);

            bool beta_on_centroid = (m_beta_loc == Location::FaceCentroid);

            AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( bx, tbx,
            {
                mlebabeclap_normalize(tbx, fab, ascalar, afab,
                                      AMREX_D_DECL(dhx, dhy, dhz),
                                      AMREX_D_DECL(bxfab, byfab, bzfab),
                                      ccmfab, flagfab, vfracfab,
                                      AMREX_D_DECL(apxfab,apyfab,apzfab),
                                      AMREX_D_DECL(fcxfab,fcyfab,fczfab),
                                      bafab, bcfab, bebfab, is_eb_dirichlet,
                                      beta_on_centroid, ncomp);
            });
        }
    }
}